

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

DVector2 __thiscall AActor::Vec2Angle(AActor *this,double length,DAngle *angle,bool absolute)

{
  double x;
  double dVar1;
  TAngle<double> *this_00;
  int in_ECX;
  undefined7 in_register_00000011;
  double dVar2;
  double dVar3;
  _func_int **pp_Var4;
  DVector2 DVar5;
  
  this_00 = (TAngle<double> *)CONCAT71(in_register_00000011,absolute);
  x = angle[9].Degrees;
  if (in_ECX == 0) {
    dVar1 = angle[10].Degrees;
    dVar2 = TAngle<double>::Cos(this_00);
    dVar3 = TAngle<double>::Sin(this_00);
    DVar5 = P_GetOffsetPosition(x,dVar1,dVar2 * length,length * dVar3);
  }
  else {
    dVar2 = TAngle<double>::Cos(this_00);
    dVar1 = angle[10].Degrees;
    dVar3 = TAngle<double>::Sin(this_00);
    pp_Var4 = (_func_int **)(length * dVar2 + x);
    DVar5.Y = dVar2;
    DVar5.X = (double)pp_Var4;
    (this->super_DThinker).super_DObject._vptr_DObject = pp_Var4;
    (this->super_DThinker).super_DObject.Class = (PClass *)(length * dVar3 + dVar1);
  }
  return DVar5;
}

Assistant:

DVector2 Vec2Angle(double length, DAngle angle, bool absolute = false)
	{
		if (absolute)
		{
			return{ X() + length * angle.Cos(), Y() + length * angle.Sin() };
		}
		else
		{
			return P_GetOffsetPosition(X(), Y(), length*angle.Cos(), length*angle.Sin());
		}
	}